

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O0

void __thiscall
duckdb::PhysicalBatchInsert::PhysicalBatchInsert
          (PhysicalBatchInsert *this,vector<duckdb::LogicalType,_true> *types_p,
          TableCatalogEntry *table,
          vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
          *bound_constraints_p,idx_t estimated_cardinality)

{
  vector<duckdb::LogicalType,_true> *in_RCX;
  TableCatalogEntry *in_RDX;
  vector<duckdb::LogicalType,_true> *in_RDI;
  undefined1 *estimated_cardinality_00;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffffb0;
  PhysicalOperatorType in_stack_ffffffffffffffbf;
  PhysicalOperator *in_stack_ffffffffffffffc0;
  
  estimated_cardinality_00 = &stack0xffffffffffffffc0;
  vector<duckdb::LogicalType,_true>::vector(in_RDI,in_RCX);
  PhysicalOperator::PhysicalOperator
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb0,
             (idx_t)estimated_cardinality_00);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x186237f);
  (in_RDI->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__PhysicalBatchInsert_0352ea78;
  optional_ptr<duckdb::TableCatalogEntry,_true>::optional_ptr
            ((optional_ptr<duckdb::TableCatalogEntry,_true> *)
             &in_RDI[5].super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish,in_RDX);
  TableCatalogEntry::GetTypes((TableCatalogEntry *)types_p);
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
  ::vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
            *)in_RDI,
           (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
            *)in_RCX);
  optional_ptr<duckdb::SchemaCatalogEntry,_true>::optional_ptr
            ((optional_ptr<duckdb::SchemaCatalogEntry,_true> *)
             &in_RDI[7].super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  ::unique_ptr((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                *)0x18623f1);
  return;
}

Assistant:

PhysicalBatchInsert::PhysicalBatchInsert(vector<LogicalType> types_p, TableCatalogEntry &table,
                                         vector<unique_ptr<BoundConstraint>> bound_constraints_p,
                                         idx_t estimated_cardinality)
    : PhysicalOperator(PhysicalOperatorType::BATCH_INSERT, std::move(types_p), estimated_cardinality),
      insert_table(&table), insert_types(table.GetTypes()), bound_constraints(std::move(bound_constraints_p)) {
}